

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O0

int pcie_cfg_read_dw(nettlp_pcie_cfg *ntpc,uint16_t dwaddr,uint8_t mask,uint32_t *data)

{
  __uint32_t _Var1;
  ssize_t sVar2;
  int *piVar3;
  __uint32_t *in_RCX;
  byte in_DL;
  uint16_t in_SI;
  long in_RDI;
  pollfd x [1];
  nettlp_pcie_cfg_pkt pkt;
  int ret;
  pollfd local_34;
  nettlp_pcie_cfg_pkt local_2a;
  int local_24;
  __uint32_t *local_20;
  long local_10;
  int local_4;
  
  local_2a._0_1_ = local_2a._0_1_ & 3 | (in_DL & 0xf) << 2;
  local_20 = in_RCX;
  local_10 = in_RDI;
  pcie_cfg_set_dwaddr(&local_2a,in_SI);
  local_2a.data = 0;
  sVar2 = write(*(int *)(local_10 + 8),&local_2a,6);
  local_24 = (int)sVar2;
  local_4 = local_24;
  if (-1 < local_24) {
    local_34.fd = *(int *)(local_10 + 8);
    local_34.events = 1;
    local_24 = poll(&local_34,1,1000);
    local_4 = local_24;
    if (-1 < local_24) {
      if (local_24 == 0) {
        piVar3 = __errno_location();
        *piVar3 = 0x3e;
        local_4 = -1;
      }
      else if ((local_34.revents & 1U) == 0) {
        piVar3 = __errno_location();
        *piVar3 = 0x3d;
        local_4 = -1;
      }
      else {
        sVar2 = read(*(int *)(local_10 + 8),&local_2a,6);
        local_24 = (int)sVar2;
        local_4 = local_24;
        if (-1 < local_24) {
          _Var1 = __bswap_32(local_2a.data);
          *local_20 = _Var1;
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int pcie_cfg_read_dw(struct nettlp_pcie_cfg *ntpc, uint16_t dwaddr,
			    uint8_t mask, uint32_t *data)
{
	int ret;
	struct nettlp_pcie_cfg_pkt pkt;
	struct pollfd x[1];

	/* send READ command */
	pkt.cmd = NETTLP_PCIE_CFG_CMD_READ;
	pkt.mask = mask;
	pcie_cfg_set_dwaddr(&pkt, dwaddr);
	pkt.data = 0;
	ret = write(ntpc->sockfd, &pkt, sizeof(pkt));
	if (ret < 0)
		return ret;

	/* receive READ command reply */
	x[0].fd = ntpc->sockfd;
	x[0].events = POLLIN;

	ret = poll(x, 1, NETTLP_PCIE_CFG_TIMEOUT);
	if (ret < 0)
		return ret;
	if (ret == 0) {
		errno = ETIME;
		return -1;
	}
	if (!(x[0].revents & POLLIN)) {
		errno = ENODATA;
		return -1;
	}

	ret = read(ntpc->sockfd, &pkt, sizeof(pkt));
	if (ret < 0)
		return ret;

	*data = be32toh(pkt.data);

	return 0;
}